

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_config(sqlite3 *db,int op,...)

{
  char *pBuf_00;
  uint sz_00;
  int cnt_00;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  char *local_108;
  u64 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  u64 local_68;
  u64 oldFlags;
  int *pRes;
  int onoff;
  uint i;
  int cnt;
  int sz;
  void *pBuf;
  undefined4 local_38;
  int rc;
  va_list ap;
  int op_local;
  sqlite3 *db_local;
  
  cnt_00 = (int)local_f8;
  pBuf_00 = local_108;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  if (op == 1000) {
    db->aDb->zDbSName = local_108;
    pBuf._4_4_ = 0;
  }
  else {
    local_f8 = in_R8;
    local_f0 = in_R9;
    if (op == 0x3e9) {
      rc = 0x30;
      sz_00 = (uint)local_100;
      i = (uint)local_100;
      local_38 = 0x28;
      local_108 = (char *)in_RDX;
      local_100 = in_RCX;
      pBuf._4_4_ = setupLookaside(db,pBuf_00,sz_00,cnt_00);
    }
    else {
      pBuf._4_4_ = 1;
      for (pRes._4_4_ = 0; pRes._4_4_ < 0xd; pRes._4_4_ = pRes._4_4_ + 1) {
        if (sqlite3_db_config::aFlagOp[pRes._4_4_].op == op) {
          rc = 0x30;
          pBuf._4_4_ = 1;
          pRes._0_4_ = (int)local_108;
          local_38 = 0x20;
          oldFlags = local_100;
          local_68 = db->flags;
          if ((int)local_108 < 1) {
            if ((int)local_108 == 0) {
              db->flags = ((ulong)sqlite3_db_config::aFlagOp[pRes._4_4_].mask ^ 0xffffffffffffffff)
                          & db->flags;
            }
          }
          else {
            db->flags = (ulong)sqlite3_db_config::aFlagOp[pRes._4_4_].mask | db->flags;
          }
          if (local_68 != db->flags) {
            local_108 = (char *)in_RDX;
            local_100 = in_RCX;
            sqlite3ExpirePreparedStatements(db,0);
          }
          if (oldFlags != 0) {
            *(uint *)oldFlags =
                 (uint)((db->flags & (ulong)sqlite3_db_config::aFlagOp[pRes._4_4_].mask) != 0);
          }
          return 0;
        }
      }
    }
  }
  return pBuf._4_4_;
}

Assistant:

SQLITE_API int sqlite3_db_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc;
  va_start(ap, op);
  switch( op ){
    case SQLITE_DBCONFIG_MAINDBNAME: {
      /* IMP: R-06824-28531 */
      /* IMP: R-36257-52125 */
      db->aDb[0].zDbSName = va_arg(ap,char*);
      rc = SQLITE_OK;
      break;
    }
    case SQLITE_DBCONFIG_LOOKASIDE: {
      void *pBuf = va_arg(ap, void*); /* IMP: R-26835-10964 */
      int sz = va_arg(ap, int);       /* IMP: R-47871-25994 */
      int cnt = va_arg(ap, int);      /* IMP: R-04460-53386 */
      rc = setupLookaside(db, pBuf, sz, cnt);
      break;
    }
    default: {
      static const struct {
        int op;      /* The opcode */
        u32 mask;    /* Mask of the bit in sqlite3.flags to set/clear */
      } aFlagOp[] = {
        { SQLITE_DBCONFIG_ENABLE_FKEY,           SQLITE_ForeignKeys    },
        { SQLITE_DBCONFIG_ENABLE_TRIGGER,        SQLITE_EnableTrigger  },
        { SQLITE_DBCONFIG_ENABLE_FTS3_TOKENIZER, SQLITE_Fts3Tokenizer  },
        { SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, SQLITE_LoadExtension  },
        { SQLITE_DBCONFIG_NO_CKPT_ON_CLOSE,      SQLITE_NoCkptOnClose  },
        { SQLITE_DBCONFIG_ENABLE_QPSG,           SQLITE_EnableQPSG     },
        { SQLITE_DBCONFIG_TRIGGER_EQP,           SQLITE_TriggerEQP     },
        { SQLITE_DBCONFIG_RESET_DATABASE,        SQLITE_ResetDatabase  },
        { SQLITE_DBCONFIG_DEFENSIVE,             SQLITE_Defensive      },
        { SQLITE_DBCONFIG_WRITABLE_SCHEMA,       SQLITE_WriteSchema|
                                                 SQLITE_NoSchemaError  },
        { SQLITE_DBCONFIG_LEGACY_ALTER_TABLE,    SQLITE_LegacyAlter    },
        { SQLITE_DBCONFIG_DQS_DDL,               SQLITE_DqsDDL         },
        { SQLITE_DBCONFIG_DQS_DML,               SQLITE_DqsDML         },
      };
      unsigned int i;
      rc = SQLITE_ERROR; /* IMP: R-42790-23372 */
      for(i=0; i<ArraySize(aFlagOp); i++){
        if( aFlagOp[i].op==op ){
          int onoff = va_arg(ap, int);
          int *pRes = va_arg(ap, int*);
          u64 oldFlags = db->flags;
          if( onoff>0 ){
            db->flags |= aFlagOp[i].mask;
          }else if( onoff==0 ){
            db->flags &= ~(u64)aFlagOp[i].mask;
          }
          if( oldFlags!=db->flags ){
            sqlite3ExpirePreparedStatements(db, 0);
          }
          if( pRes ){
            *pRes = (db->flags & aFlagOp[i].mask)!=0;
          }
          rc = SQLITE_OK;
          break;
        }
      }
      break;
    }
  }
  va_end(ap);
  return rc;
}